

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O2

IDenseNetwork * __thiscall
IDenseNetwork::GradStep
          (IDenseNetwork *this,size_t batchSize,float learningRateV,float learningRateW,float beta,
          float lambda)

{
  ILayer *pIVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  long lVar4;
  
  for (lVar4 = (long)(this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      ppIVar3 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                super__Vector_impl_data._M_start, lVar4 != 1; lVar4 = lVar4 + -1) {
    pIVar1 = ppIVar3[lVar4 + -1];
    (*pIVar1->_vptr_ILayer[8])(learningRateV,learningRateW,beta,lambda,pIVar1,batchSize,0);
  }
  pIVar1 = *ppIVar3;
  (*pIVar1->_vptr_ILayer[8])(learningRateV,learningRateW,beta,lambda,pIVar1,batchSize,1,0);
  ppIVar2 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar3 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar3 != ppIVar2; ppIVar3 = ppIVar3 + 1) {
    (*(*ppIVar3)->_vptr_ILayer[7])();
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::GradStep( size_t batchSize, float learningRateV, float learningRateW, float beta,
                                        float lambda )
{
    for ( size_t ldx = layers.size() - 1; ldx > 0; --ldx ) {
        layers[ldx]->GradStep( batchSize, learningRateV, learningRateW, beta, false, lambda, ldx == layers.size() - 1 );
    }
    layers.front()->GradStep( batchSize, learningRateV, learningRateW, beta, true, lambda, false );
    for ( auto layer: layers ) {
        layer->ResetGrad();
    }
    return *this;
}